

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QHash<int,_QVariant>_>::copyAppend
          (QGenericArrayOps<QHash<int,_QVariant>_> *this,QHash<int,_QVariant> *b,
          QHash<int,_QVariant> *e)

{
  QHash<int,_QVariant> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QHash<int,_QVariant> *in_RDI;
  QHash<int,_QVariant> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QHash<int,_QVariant>_>::begin
                        ((QArrayDataPointer<QHash<int,_QVariant>_> *)0x156a97);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QHash<int,_QVariant>::QHash(this_00,in_RDI);
      local_10 = local_10 + 8;
      in_RDI[2].d = (Data *)((long)&((in_RDI[2].d)->ref).atomic._q_value.super___atomic_base<int>.
                                    _M_i + 1);
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }